

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplewidgets.cpp
# Opt level: O2

State __thiscall QAccessibleButton::state(QAccessibleButton *this)

{
  uint uVar1;
  bool bVar2;
  CheckState CVar3;
  State SVar4;
  QObject *object;
  QCheckBox *this_00;
  QPushButton *this_01;
  QMenu *pQVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  
  SVar4 = QAccessibleWidget::state(&this->super_QAccessibleWidget);
  object = (QObject *)button(this);
  this_00 = QtPrivate::qobject_cast_helper<QCheckBox*,QObject>(object);
  bVar2 = QAbstractButton::isCheckable((QAbstractButton *)object);
  uVar6 = SVar4._0_4_ | 0x20;
  if (!bVar2) {
    uVar6 = SVar4._0_4_;
  }
  bVar2 = QAbstractButton::isChecked((QAbstractButton *)object);
  uVar1 = uVar6 | 0x40;
  if (!bVar2) {
    uVar1 = uVar6;
  }
  uVar8 = (ulong)uVar1;
  if (this_00 != (QCheckBox *)0x0) {
    CVar3 = QCheckBox::checkState(this_00);
    uVar8 = (ulong)uVar1;
    if (CVar3 == PartiallyChecked) {
      uVar8 = (ulong)(uVar1 | 0x80);
    }
  }
  bVar2 = QAbstractButton::isDown((QAbstractButton *)object);
  uVar7 = (ulong)((uint)uVar8 | 0x10);
  if (!bVar2) {
    uVar7 = uVar8;
  }
  this_01 = QtPrivate::qobject_cast_helper<QPushButton*,QObject>(object);
  if (this_01 != (QPushButton *)0x0) {
    bVar2 = QPushButton::isDefault(this_01);
    uVar8 = (ulong)((uint)uVar7 | 0x400);
    if (!bVar2) {
      uVar8 = uVar7;
    }
    pQVar5 = QPushButton::menu(this_01);
    uVar7 = (ulong)((uint)uVar8 | 0x10000000);
    if (pQVar5 == (QMenu *)0x0) {
      uVar7 = uVar8;
    }
  }
  return (State)(uVar7 | (ulong)SVar4 & 0xff00000000 | 0xaaaaaa0000000000);
}

Assistant:

QAccessible::State QAccessibleButton::state() const
{
    QAccessible::State state = QAccessibleWidget::state();

    QAbstractButton *b = button();
#if QT_CONFIG(checkbox)
    QCheckBox *cb = qobject_cast<QCheckBox *>(b);
#endif
    if (b->isCheckable())
        state.checkable = true;
    if (b->isChecked())
        state.checked = true;
#if QT_CONFIG(checkbox)
    if (cb && cb->checkState() == Qt::PartiallyChecked)
        state.checkStateMixed = true;
#endif
    if (b->isDown())
        state.pressed = true;
#if QT_CONFIG(pushbutton)
    QPushButton *pb = qobject_cast<QPushButton*>(b);
    if (pb) {
        if (pb->isDefault())
            state.defaultButton = true;
#if QT_CONFIG(menu)
        if (pb->menu())
            state.hasPopup = true;
#endif
    }
#endif

    return state;
}